

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

void stack_node_add_link(StackNode *self,StackLink link,SubtreePool *subtree_pool)

{
  ushort uVar1;
  Subtree self_00;
  StackNode *pSVar2;
  StackLink SVar3;
  _Bool _Var4;
  _Bool _Var5;
  ushort uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  int32_t iVar10;
  int iVar11;
  ushort uVar12;
  StackLink *pSVar13;
  uint uVar14;
  long lVar15;
  int j;
  ulong uVar16;
  Length LVar17;
  Length LVar18;
  
  SVar3 = link;
  if (link.node != self) {
    uVar1 = self->link_count;
    for (lVar15 = 0; (ulong)uVar1 * 0x18 - lVar15 != 0; lVar15 = lVar15 + 0x18) {
      self_00 = *(Subtree *)((long)&self->links[0].subtree + lVar15);
      if (self_00.ptr == link.subtree.ptr) {
LAB_001185a0:
        pSVar2 = *(StackNode **)((long)&self->links[0].node + lVar15);
        if (pSVar2 == link.node) {
          iVar11 = 0;
          if ((((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
             ((link.subtree.ptr)->child_count != 0)) {
            iVar11 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
          }
          iVar10 = 0;
          if ((((ulong)self_00.ptr & 1) == 0) && (iVar10 = 0, (self_00.ptr)->child_count != 0)) {
            iVar10 = ((self_00.ptr)->field_17).field_0.dynamic_precedence;
          }
          if (iVar11 <= iVar10) {
            return;
          }
          ts_subtree_retain(link.subtree);
          ts_subtree_release(subtree_pool,*(Subtree *)((long)&self->links[0].subtree + lVar15));
          *(Subtree *)((long)&self->links[0].subtree + lVar15) = link.subtree;
          iVar11 = 0;
          if ((((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
             (iVar11 = 0, (link.subtree.ptr)->child_count != 0)) {
            iVar11 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
          }
          self->dynamic_precedence = iVar11 + (link.node)->dynamic_precedence;
          return;
        }
        if ((pSVar2->state == (link.node)->state) &&
           ((pSVar2->position).bytes == ((link.node)->position).bytes)) {
          pSVar13 = (link.node)->links;
          for (uVar16 = 0; uVar16 < (link.node)->link_count; uVar16 = uVar16 + 1) {
            stack_node_add_link(*(StackNode **)((long)&self->links[0].node + lVar15),*pSVar13,
                                subtree_pool);
            pSVar13 = pSVar13 + 1;
          }
          iVar11 = (link.node)->dynamic_precedence;
          if (link.subtree.ptr != (SubtreeHeapData *)0x0) {
            iVar9 = 0;
            if ((((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
               (iVar9 = 0, (link.subtree.ptr)->child_count != 0)) {
              iVar9 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
            }
            iVar11 = iVar11 + iVar9;
          }
          if (iVar11 <= self->dynamic_precedence) {
            return;
          }
          self->dynamic_precedence = iVar11;
          return;
        }
      }
      else if (self_00.ptr != (SubtreeHeapData *)0x0 && link.subtree.ptr != (SubtreeHeapData *)0x0)
      {
        if (((ulong)self_00.ptr & 1) == 0) {
          uVar6 = (self_00.ptr)->symbol;
        }
        else {
          uVar6 = (ushort)self_00.data.symbol;
        }
        uVar12 = (ushort)link.subtree._1_1_;
        if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
          uVar12 = (link.subtree.ptr)->symbol;
        }
        if (uVar6 == uVar12) {
          uVar7 = ts_subtree_error_cost(self_00);
          if ((uVar7 != 0) && (uVar7 = ts_subtree_error_cost(link.subtree), uVar7 != 0))
          goto LAB_001185a0;
          LVar17 = ts_subtree_padding(self_00);
          LVar18 = ts_subtree_padding(link.subtree);
          if (LVar17.bytes == LVar18.bytes) {
            LVar17 = ts_subtree_size(self_00);
            LVar18 = ts_subtree_size(link.subtree);
            if (LVar17.bytes == LVar18.bytes) {
              uVar8 = 0;
              uVar7 = 0;
              if (((ulong)self_00.ptr & 1) == 0) {
                uVar7 = (self_00.ptr)->child_count;
              }
              if (((undefined1  [24])link & (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                uVar8 = (link.subtree.ptr)->child_count;
              }
              if (uVar7 == uVar8) {
                _Var4 = ts_subtree_extra(self_00);
                _Var5 = ts_subtree_extra(link.subtree);
                if ((_Var4 == _Var5) &&
                   (_Var4 = ts_subtree_external_scanner_state_eq(self_00,link.subtree), _Var4))
                goto LAB_001185a0;
              }
            }
          }
        }
      }
    }
    if (uVar1 != 8) {
      stack_node_retain(link.node);
      uVar14 = (link.node)->node_count;
      iVar11 = (link.node)->dynamic_precedence;
      uVar1 = self->link_count;
      self->link_count = uVar1 + 1;
      self->links[uVar1].is_pending = link.is_pending;
      *(undefined7 *)&self->links[uVar1].field_0x11 = link._17_7_;
      self->links[uVar1].node = link.node;
      self->links[uVar1].subtree = link.subtree;
      if (link.subtree.ptr != (SubtreeHeapData *)0x0) {
        ts_subtree_retain(link.subtree);
        uVar7 = 1;
        iVar9 = 0;
        if ((((undefined1  [24])SVar3 & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
           (iVar9 = 0, (link.subtree.ptr)->child_count != 0)) {
          uVar7 = ((link.subtree.ptr)->field_17).field_0.node_count;
          iVar9 = ((link.subtree.ptr)->field_17).field_0.dynamic_precedence;
        }
        uVar14 = uVar14 + uVar7;
        iVar11 = iVar11 + iVar9;
      }
      if (self->node_count < uVar14) {
        self->node_count = uVar14;
      }
      if (self->dynamic_precedence < iVar11) {
        self->dynamic_precedence = iVar11;
      }
    }
  }
  return;
}

Assistant:

static void stack_node_add_link(StackNode *self, StackLink link, SubtreePool *subtree_pool) {
  if (link.node == self) return;

  for (int i = 0; i < self->link_count; i++) {
    StackLink *existing_link = &self->links[i];
    if (stack__subtree_is_equivalent(existing_link->subtree, link.subtree)) {
      // In general, we preserve ambiguities until they are removed from the stack
      // during a pop operation where multiple paths lead to the same node. But in
      // the special case where two links directly connect the same pair of nodes,
      // we can safely remove the ambiguity ahead of time without changing behavior.
      if (existing_link->node == link.node) {
        if (
          ts_subtree_dynamic_precedence(link.subtree) >
          ts_subtree_dynamic_precedence(existing_link->subtree)
        ) {
          ts_subtree_retain(link.subtree);
          ts_subtree_release(subtree_pool, existing_link->subtree);
          existing_link->subtree = link.subtree;
          self->dynamic_precedence =
            link.node->dynamic_precedence + ts_subtree_dynamic_precedence(link.subtree);
        }
        return;
      }

      // If the previous nodes are mergeable, merge them recursively.
      if (existing_link->node->state == link.node->state &&
          existing_link->node->position.bytes == link.node->position.bytes) {
        for (int j = 0; j < link.node->link_count; j++) {
          stack_node_add_link(existing_link->node, link.node->links[j], subtree_pool);
        }
        int32_t dynamic_precedence = link.node->dynamic_precedence;
        if (link.subtree.ptr) {
          dynamic_precedence += ts_subtree_dynamic_precedence(link.subtree);
        }
        if (dynamic_precedence > self->dynamic_precedence) {
          self->dynamic_precedence = dynamic_precedence;
        }
        return;
      }
    }
  }

  if (self->link_count == MAX_LINK_COUNT) return;

  stack_node_retain(link.node);
  unsigned node_count = link.node->node_count;
  int dynamic_precedence = link.node->dynamic_precedence;
  self->links[self->link_count++] = link;

  if (link.subtree.ptr) {
    ts_subtree_retain(link.subtree);
    node_count += ts_subtree_node_count(link.subtree);
    dynamic_precedence += ts_subtree_dynamic_precedence(link.subtree);
  }

  if (node_count > self->node_count) self->node_count = node_count;
  if (dynamic_precedence > self->dynamic_precedence) self->dynamic_precedence = dynamic_precedence;
}